

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
StatisticsWriter::writeMatrix<double>
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker,string *title,
          offset_in_MultivariateTracker_to_subr matrix)

{
  long *plVar1;
  pointer pSVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  ostream *poVar6;
  code *pcVar7;
  pointer plVar8;
  long j;
  long lVar9;
  size_type sVar10;
  ios *this_00;
  long in_R9;
  size_type sVar11;
  long lVar12;
  size_type __n;
  ulong uVar13;
  double dVar14;
  vector<long,_std::allocator<long>_> width;
  string header;
  double d;
  string indent;
  string footer;
  char *local_290;
  long local_288;
  char local_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  undefined4 uStack_27c;
  vector<long,_std::allocator<long>_> local_270;
  long *local_258;
  long local_250;
  long local_248 [2];
  long local_238;
  double local_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  long local_1c8;
  string *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1c8 = ((long)(tracker->_statistics).
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(tracker->_statistics).
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x34f72c234f72c235;
  __n = (size_type)(int)local_1c8;
  local_1b8 = (long *)0x0;
  local_238 = in_R9;
  local_1c0 = title;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_270,__n,(value_type_conflict2 *)&local_1b8,(allocator_type *)&local_258);
  if (0 < (long)__n) {
    lVar12 = 0x16;
    lVar9 = 0;
    sVar11 = __n;
    do {
      pSVar2 = (tracker->_statistics).
               super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      lVar3 = *(long *)((long)pSVar2 + lVar12 * 8 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,lVar3,(&pSVar2->_count)[lVar12] + lVar3);
      StringParser::updateWidthString
                (&local_1e8,
                 (long *)((long)local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar9));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 0x1d;
      lVar9 = lVar9 + 8;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    if (0 < (long)__n) {
      plVar1 = (long *)((long)&(tracker->_covariance).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + local_238);
      sVar11 = 0;
      do {
        lVar9 = 0;
        sVar10 = 0;
        do {
          pcVar7 = (code *)matrix;
          if ((matrix & 1) != 0) {
            pcVar7 = *(code **)(*plVar1 + -1 + matrix);
          }
          dVar14 = (double)(*pcVar7)(plVar1,sVar11,sVar10);
          StringParser::updateWidthNumber<double>
                    (dVar14,(long *)((long)local_270.super__Vector_base<long,_std::allocator<long>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar9));
          sVar10 = sVar10 + 1;
          lVar9 = lVar9 + 8;
        } while (__n != sVar10);
        sVar11 = sVar11 + 1;
      } while (sVar11 != __n);
    }
  }
  uVar5 = 0;
  for (plVar8 = local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar8 != local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish; plVar8 = plVar8 + 1) {
    lVar9 = *plVar8;
    *plVar8 = lVar9 + 3;
    uVar5 = uVar5 + lVar9 + 3;
  }
  uVar13 = 0x14;
  if (0x14 < (long)uVar5) {
    uVar13 = uVar5;
  }
  local_258 = local_248;
  std::__cxx11::string::_M_construct((string *)&local_258,uVar13,'=');
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct((string *)&local_208,uVar13,'-');
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_258,local_250);
  cVar4 = std::ios::widen((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)),'\n');
  poVar6 = (ostream *)std::ostream::put(poVar6,cVar4);
  std::ostream::flush(poVar6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  lVar9 = *(long *)poVar6;
  this_00 = (ios *)(poVar6 + *(long *)(lVar9 + -0x18));
  if (poVar6[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen(this_00,' ');
    this_00[0xe1] = (ios)0x1;
    lVar9 = *(long *)poVar6;
  }
  this_00[0xe0] = (ios)0x20;
  *(long *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)(uVar13 >> 1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(local_1c0->_M_dataplus)._M_p,local_1c0->_M_string_length);
  cVar4 = std::ios::widen((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)),'\n');
  poVar6 = (ostream *)std::ostream::put(poVar6,cVar4);
  std::ostream::flush(poVar6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_258,local_250);
  cVar4 = std::ios::widen((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)),'\n');
  poVar6 = (ostream *)std::ostream::put(poVar6,cVar4);
  std::ostream::flush(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,(this->_comment)._M_dataplus._M_p,(this->_comment)._M_string_length);
  if ((int)local_1c8 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"No Data",7);
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar6 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar6);
  }
  else {
    if (0 < (long)__n) {
      lVar9 = 0x16;
      sVar11 = 0;
      do {
        lVar12 = *(long *)stream;
        lVar3 = *(long *)(lVar12 + -0x18);
        *(uint *)(stream + lVar3 + 0x18) = *(uint *)(stream + lVar3 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(stream + *(long *)(lVar12 + -0x18) + 0x10) =
             (long)(int)local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar11];
        pSVar2 = (tracker->_statistics).
                 super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = *(long *)((long)pSVar2 + lVar9 * 8 + -8);
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,lVar12,(&pSVar2->_count)[lVar9] + lVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)stream,(char *)local_1b8,local_1b0);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        sVar11 = sVar11 + 1;
        lVar9 = lVar9 + 0x1d;
      } while (__n != sVar11);
    }
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar6 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_208,local_200);
    cVar4 = std::ios::widen((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)),'\n');
    poVar6 = (ostream *)std::ostream::put(poVar6,cVar4);
    std::ostream::flush(poVar6);
    local_228 = local_218;
    std::__cxx11::string::_M_construct((string *)&local_228,(this->_comment)._M_string_length,' ');
    if (0 < (long)__n) {
      plVar1 = (long *)((long)&(tracker->_covariance).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + local_238);
      sVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)stream,(char *)local_228,local_220);
        sVar10 = 0;
        do {
          lVar9 = *(long *)stream;
          lVar12 = *(long *)(lVar9 + -0x18);
          *(uint *)(stream + lVar12 + 0x18) = *(uint *)(stream + lVar12 + 0x18) & 0xffffff4f | 0x80;
          *(long *)(stream + *(long *)(lVar9 + -0x18) + 0x10) =
               (long)(int)local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar10];
          pcVar7 = (code *)matrix;
          if ((matrix & 1) != 0) {
            pcVar7 = *(code **)(*plVar1 + -1 + matrix);
          }
          dVar14 = (double)(*pcVar7)(plVar1,sVar11,sVar10);
          local_290 = &local_280;
          local_230 = dVar14;
          if (NAN(dVar14)) {
            uStack_27e = 0x6e;
            local_280 = 'n';
            uStack_27f = 0x61;
            local_288 = 3;
            uStack_27d = 0;
          }
          else {
            local_288 = 0;
            local_280 = '\0';
            std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xfffffefb | 4;
            std::ostream::_M_insert<double>((ostream *)local_1a8,dVar14);
            std::operator>>((istream *)&local_1b8,(string *)&local_290);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_290,local_288);
          if (local_290 != &local_280) {
            operator_delete(local_290,
                            CONCAT44(uStack_27c,
                                     CONCAT13(uStack_27d,
                                              CONCAT12(uStack_27e,CONCAT11(uStack_27f,local_280))))
                            + 1);
          }
          sVar10 = sVar10 + 1;
        } while (__n != sVar10);
        cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
        poVar6 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
        std::ostream::flush(poVar6);
        sVar11 = sVar11 + 1;
      } while (sVar11 != __n);
    }
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar6 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar6);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
    writeMatrix(std::ostream & stream,
                MultivariateTracker & tracker,
                std::string const & title,
                T (MultivariateTracker::*matrix)(long const i, long const j) const)
    {

        int numDim = tracker.getDimension();

        // Compute column widths
        std::vector<long> width(numDim,0);
        for (long i = 0; i < numDim; i++)
        {
            StringParser::updateWidthString(tracker.getName(i), width[i]);
        }
        for (long i = 0; i < numDim; i++)
        {
            for (long j = 0; j < numDim; j++)
            {
                StringParser::updateWidthNumber<T>((tracker.*matrix)(i,j), width[j]);
            }
        }

        long totalWidth = 0;
        for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
        {
            (*it) += 3;
            totalWidth += *it;
        }
        totalWidth = std::max<long>(totalWidth, 20);

        // Print data headers
        std::string header(totalWidth,'='); 
        std::string footer(totalWidth,'-'); 
        stream << this->_comment << header << std::endl;
        stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << title << std::endl;
        stream << this->_comment << header << std::endl;
        stream << this->_comment;
        if (numDim == 0)
        {
            stream << "No Data" << std::endl;
            return;
        }
        for (long i = 0; i < numDim; i++)
        {
            stream << std::right << std::setw(width[i]) << tracker.getName(i);
        }
        stream << std::endl;
        stream << this->_comment << footer << std::endl;

        // Print data
        std::string indent(this->_comment.size(),' '); 
        for (long i = 0; i < numDim; i++)
        {
            stream << indent;
            for (long j = 0; j < numDim; j++)
            {
                stream << std::right << std::setw(width[j]) << StringParser::parseNumber<T>((tracker.*matrix)(i,j));
            }
            stream << std::endl;
        }
        stream << std::endl;
    
        return;
        
    }